

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testoverlay.c
# Opt level: O1

void ConvertRGBtoYUY2(SDL_Surface *s,SDL_Overlay *o,int monochrome,int luminance)

{
  Uint8 *pUVar1;
  uint uVar2;
  int iVar3;
  Uint8 *rgb;
  ulong uVar4;
  int yuv [3];
  Uint8 local_3c [4];
  Uint8 local_38;
  Uint8 local_34;
  
  SDL_LockSurface();
  SDL_LockYUVOverlay(o);
  if (0 < s->h) {
    iVar3 = 0;
    do {
      if (o->h <= iVar3) break;
      if (0 < s->w) {
        rgb = (Uint8 *)((ulong)((uint)s->pitch * iVar3) + (long)s->pixels);
        uVar2 = (uint)*o->pitches * iVar3;
        pUVar1 = *o->pixels;
        uVar4 = 0;
        do {
          if (o->w <= (int)uVar4) break;
          RGBtoYUV(rgb,(int *)local_3c,monochrome,luminance);
          if ((uVar4 & 1) == 0) {
            pUVar1[uVar4 * 2 + (ulong)uVar2] = local_3c[0];
            pUVar1[uVar4 * 2 + (ulong)uVar2 + 1] = local_38;
            pUVar1[uVar4 * 2 + (ulong)uVar2 + 3] = local_34;
          }
          else {
            pUVar1[uVar4 * 2 + (ulong)uVar2] = local_3c[0];
          }
          rgb = rgb + s->format->BytesPerPixel;
          uVar4 = uVar4 + 1;
        } while ((int)uVar4 < s->w);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < s->h);
  }
  SDL_UnlockYUVOverlay(o);
  SDL_UnlockSurface(s);
  return;
}

Assistant:

void ConvertRGBtoYUY2(SDL_Surface *s, SDL_Overlay *o, int monochrome, int luminance)
{
	int x,y;
	int yuv[3];
	Uint8 *p,*op;

	SDL_LockSurface(s);
	SDL_LockYUVOverlay(o);

	for(y=0; y<s->h && y<o->h; y++)
	{
		p=((Uint8 *) s->pixels)+s->pitch*y;
		op=o->pixels[0]+o->pitches[0]*y;
		for(x=0; x<s->w && x<o->w; x++)
		{
			RGBtoYUV(p,yuv, monochrome, luminance);
			if(x%2==0)
			{
				*(op++)=yuv[0];
				*(op++)=yuv[1];
				op[1]=yuv[2];
			}
			else
			{
				*op=yuv[0];
				op+=2;
			}

			p+=s->format->BytesPerPixel;
		}
	}

	SDL_UnlockYUVOverlay(o);
	SDL_UnlockSurface(s);
}